

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp2.c
# Opt level: O2

ReturnCode control(Global *global,int *counter)

{
  char cVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ReturnCode RVar6;
  undefined8 in_RAX;
  ushort **ppuVar7;
  char *pcVar8;
  byte bVar9;
  ErrorCode EVar10;
  char *pcVar11;
  int hash;
  int local_38;
  int result;
  
  _local_38 = in_RAX;
  iVar3 = skipws(global);
  if ((iVar3 == 10) || (iVar3 == 0)) goto LAB_00102eb9;
  ppuVar7 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar7 + (long)iVar3 * 2 + 1) & 8) == 0) {
    scanid(global,iVar3);
  }
  else {
    unget(global);
    builtin_strncpy(global->tokenbuf,"line",5);
  }
  pcVar8 = global->tokenbuf;
  if (pcVar8[1] == '\0') {
switchD_00102f38_caseD_12e:
    iVar3 = 0;
    pcVar11 = "";
  }
  else {
    iVar3 = (int)*pcVar8 + pcVar8[2] * 2;
    switch((int)*pcVar8 + pcVar8[2] * 2) {
    case 0x12d:
      pcVar11 = "endif";
      break;
    case 0x12e:
    case 0x133:
    case 0x134:
    case 0x135:
    case 0x136:
    case 0x138:
    case 0x139:
    case 0x13a:
    case 0x13b:
    case 0x13c:
      goto switchD_00102f38_caseD_12e;
    case 0x12f:
      pcVar11 = "include";
      break;
    case 0x130:
      pcVar11 = "define";
      break;
    case 0x131:
      pcVar11 = "ifdef";
      break;
    case 0x132:
      pcVar11 = "pragma";
      break;
    case 0x137:
      pcVar11 = "elif";
      break;
    case 0x13d:
      pcVar11 = "undef";
      break;
    default:
      switch(iVar3) {
      case 0x145:
        pcVar11 = "ifndef";
        break;
      case 0x146:
      case 0x14a:
        goto switchD_00102f38_caseD_12e;
      case 0x147:
        pcVar11 = "assert";
        break;
      case 0x148:
        pcVar11 = "line";
        break;
      case 0x149:
        pcVar11 = "error";
        break;
      case 0x14b:
        pcVar11 = "else";
        break;
      default:
        if (iVar3 != 0x69) goto switchD_00102f38_caseD_12e;
        pcVar11 = "if";
      }
    }
  }
  iVar4 = strcmp(pcVar11,pcVar8);
  hash = 0;
  if (iVar4 == 0) {
    hash = iVar3;
  }
  if (global->infile->fp == (FILE *)0x0) {
    cerror(global,WARN_CONTROL_LINE_IN_MACRO,pcVar8);
  }
  if (global->ifstack[0] == '\0') {
    uVar5 = hash - 0x12f;
    if (uVar5 < 0x1b) {
      if ((0x700400bU >> (uVar5 & 0x1f) & 1) != 0) goto LAB_00102ffa;
      if ((0x400004U >> (uVar5 & 0x1f) & 1) == 0) goto LAB_001030e9;
    }
    else {
LAB_001030e9:
      if (hash != 0x69) goto LAB_00102fb4;
    }
    pcVar8 = global->ifptr + 1;
    global->ifptr = pcVar8;
    if (pcVar8 < &global->field_0x275) {
      *pcVar8 = '\0';
      goto LAB_00102ffa;
    }
    goto LAB_00103156;
  }
LAB_00102fb4:
  pcVar8 = global->ifstack;
  if (0 < *counter) {
    switch(hash) {
    case 0x12d:
      goto switchD_00102fda_caseD_12d;
    case 0x12e:
    case 0x133:
    case 0x134:
    case 0x135:
    case 0x136:
    case 0x138:
    case 0x139:
    case 0x13a:
    case 0x13b:
    case 0x13c:
      goto switchD_00102fda_caseD_12e;
    case 0x12f:
      goto switchD_00102fda_caseD_12f;
    case 0x130:
      goto switchD_00102fda_caseD_130;
    case 0x131:
      goto switchD_00102fda_caseD_131;
    case 0x132:
switchD_00102fda_caseD_132:
      Putchar(global,10);
      *counter = *counter + -1;
      break;
    case 0x137:
      goto switchD_00102fda_caseD_137;
    case 0x13d:
      goto switchD_00102fda_caseD_13d;
    default:
      switch(hash) {
      case 0x145:
        goto switchD_00102fda_caseD_131;
      case 0x146:
      case 0x14a:
        goto switchD_00102fda_caseD_12e;
      case 0x147:
        goto switchD_00103028_caseD_147;
      case 0x148:
        goto switchD_00102fda_caseD_132;
      case 0x149:
        goto switchD_00103028_caseD_149;
      case 0x14b:
        goto switchD_00103028_caseD_14b;
      default:
        goto switchD_00103028_default;
      }
    }
  }
  switch(hash) {
  case 0x12d:
switchD_00102fda_caseD_12d:
    pbVar2 = (byte *)global->ifptr;
    if (pbVar2 == (byte *)pcVar8) {
LAB_001032e6:
      pcVar8 = global->tokenbuf;
      EVar10 = ERROR_STRING_MUST_BE_IF;
LAB_0010337a:
      cerror(global,EVar10,pcVar8);
      dump_line(global,counter);
      return FPP_OK;
    }
    bVar9 = *pbVar2;
    if ((bVar9 & 1) != 0 && *pcVar8 == '\0') {
      global->wrongline = 1;
      bVar9 = *pbVar2;
    }
    global->ifstack[0] = bVar9 & 1;
    global->ifptr = (char *)(pbVar2 + -1);
    break;
  case 0x12e:
  case 0x133:
  case 0x134:
  case 0x135:
  case 0x136:
  case 0x138:
  case 0x139:
  case 0x13a:
  case 0x13b:
  case 0x13c:
    goto switchD_00102fda_caseD_12e;
  case 0x12f:
switchD_00102fda_caseD_12f:
    iVar3 = skipws(global);
    _local_38 = CONCAT44(result,iVar3);
    RVar6 = macroid(global,&stack0xffffffffffffffc8);
    if (RVar6 != FPP_OK) {
      return RVar6;
    }
    if (local_38 == 0x22) {
LAB_001031fd:
      pcVar8 = global->work;
      global->workp = pcVar8;
      while ((iVar3 = get(global), iVar3 != 0 && (iVar3 != 10))) {
        RVar6 = save(global,iVar3);
        if (RVar6 != FPP_OK) {
          return RVar6;
        }
      }
      unget(global);
      pcVar11 = global->workp;
      do {
        pcVar11 = pcVar11 + -1;
        global->workp = pcVar11;
        cVar1 = *pcVar11;
        if (pcVar11 < pcVar8) break;
      } while ((cVar1 == ' ') || (cVar1 == '\t'));
      if (local_38 == cVar1) {
        *pcVar11 = '\0';
        RVar6 = openinclude(global,pcVar8,(uint)(local_38 == 0x22));
        if ((RVar6 != FPP_OK) && (global->warnnoinclude != '\0')) {
          cerror(global,WARN_CANNOT_OPEN_INCLUDE,pcVar8);
        }
        goto LAB_001033d0;
      }
    }
    else if (local_38 == 0x3c) {
      _local_38 = CONCAT44(result,0x3e);
      goto LAB_001031fd;
    }
    cerror(global,ERROR_INCLUDE_SYNTAX);
    goto LAB_001033d0;
  case 0x130:
switchD_00102fda_caseD_130:
    RVar6 = dodefine(global);
    goto LAB_00103246;
  case 0x131:
switchD_00102fda_caseD_131:
    pcVar8 = global->ifptr + 1;
    global->ifptr = pcVar8;
    if (&global->field_0x275 <= pcVar8) {
LAB_00103156:
      cerror(global,FATAL_TOO_MANY_NESTINGS,global->tokenbuf);
      return FPP_TOO_MANY_NESTED_STATEMENTS;
    }
    *pcVar8 = '\x01';
    RVar6 = doif(global,hash);
    if (RVar6 != FPP_OK) {
      return RVar6;
    }
    goto LAB_001033d0;
  case 0x132:
    Putstring(global,"#pragma ");
    while ((iVar3 = get(global), iVar3 != 0 && (iVar3 != 10))) {
      Putchar(global,iVar3);
    }
    goto LAB_001033bd;
  case 0x137:
switchD_00102fda_caseD_137:
    if (global->ifptr == pcVar8) goto LAB_001032e6;
    bVar9 = *global->ifptr;
    if ((bVar9 & 2) != 0) {
LAB_0010336e:
      pcVar8 = global->tokenbuf;
      EVar10 = ERROR_STRING_MAY_NOT_FOLLOW_ELSE;
      goto LAB_0010337a;
    }
    if ((bVar9 & 5) != 1) {
      global->ifstack[0] = '\0';
LAB_00102ffa:
      dump_line(global,counter);
      return FPP_OK;
    }
    RVar6 = doif(global,0x69);
LAB_00103246:
    if (RVar6 != FPP_OK) {
      return RVar6;
    }
    break;
  case 0x13d:
switchD_00102fda_caseD_13d:
    doundef(global);
    break;
  default:
    switch(hash) {
    case 0x145:
      goto switchD_00102fda_caseD_131;
    case 0x146:
    case 0x14a:
      break;
    case 0x147:
      goto switchD_00103028_caseD_147;
    case 0x148:
      iVar3 = skipws(global);
      pcVar8 = global->work;
      global->workp = pcVar8;
      while ((iVar3 != 0 && (iVar3 != 10))) {
        RVar6 = save(global,iVar3);
        if (RVar6 != FPP_OK) {
          return RVar6;
        }
        iVar3 = get(global);
      }
      unget(global);
      RVar6 = save(global,0);
      if (RVar6 != FPP_OK) {
        return RVar6;
      }
      iVar3 = atoi(pcVar8);
      global->line = iVar3 + -1;
      while ((bVar9 = *pcVar8, (*(byte *)((long)*ppuVar7 + (long)(char)bVar9 * 2 + 1) & 8) != 0 ||
             (type[bVar9] == 'C'))) {
        pcVar8 = pcVar8 + 1;
      }
      if ((ulong)bVar9 != 0) {
        if (bVar9 == 0x22) {
          pcVar11 = strrchr(pcVar8 + 1,0x22);
          if (pcVar11 != (char *)0x0) {
            *pcVar11 = '\0';
            pcVar8 = pcVar8 + 1;
          }
        }
        pcVar11 = global->infile->progname;
        if (pcVar11 != (char *)0x0) {
          Freemem(pcVar11);
        }
        pcVar8 = savestring(global,pcVar8);
        global->infile->progname = pcVar8;
      }
      global->wrongline = 1;
      goto LAB_001033d0;
    case 0x149:
switchD_00103028_caseD_149:
      EVar10 = ERROR_ERROR;
      goto LAB_0010328b;
    case 0x14b:
switchD_00103028_caseD_14b:
      pbVar2 = (byte *)global->ifptr;
      if (pbVar2 != (byte *)pcVar8) {
        if ((*pbVar2 & 2) == 0) {
          *pbVar2 = *pbVar2 | 2;
          if ((*global->ifptr & 1U) != 0) {
            if (((*global->ifptr & 4U) == 0) && (*pcVar8 == '\0')) {
              *pcVar8 = '\x01';
            }
            else {
              *pcVar8 = '\0';
            }
          }
          goto LAB_001033dd;
        }
        goto LAB_0010336e;
      }
      goto LAB_001032e6;
    default:
switchD_00103028_default:
      if (hash == 0x69) goto switchD_00102fda_caseD_131;
    }
    goto switchD_00102fda_caseD_12e;
  }
  goto LAB_001033dd;
switchD_00103028_caseD_147:
  RVar6 = eval(global,&result);
  if (RVar6 != FPP_OK) {
    return RVar6;
  }
  if (result == 0) {
    EVar10 = ERROR_PREPROC_FAILURE;
LAB_0010328b:
    cerror(global,EVar10);
  }
  goto LAB_001033dd;
switchD_00102fda_caseD_12e:
  if (global->warnillegalcpp != '\0') {
    cerror(global,WARN_ILLEGAL_COMMAND,global->tokenbuf);
  }
  Putchar(global,0x23);
  Putstring(global,global->tokenbuf);
  iVar3 = 0x20;
  do {
    Putchar(global,iVar3);
    iVar3 = get(global);
    if (iVar3 == 0) break;
  } while (iVar3 != 10);
LAB_001033bd:
  unget(global);
  Putchar(global,10);
LAB_001033d0:
  if (hash == 0x12f) goto LAB_00102eb9;
LAB_001033dd:
  iVar3 = skipws(global);
  if (iVar3 != 10) {
    cerror(global,WARN_UNEXPECTED_TEXT_IGNORED);
    skipnl(global);
  }
LAB_00102eb9:
  *counter = *counter + 1;
  return FPP_OK;
}

Assistant:

ReturnCode control( struct Global *global,
    int *counter )  /* Pending newline counter */
{
    /*
     * Process #control lines.  Simple commands are processed inline,
     * while complex commands have their own subroutines.
     *
     * The counter is used to force out a newline before #line, and
     * #pragma commands.  This prevents these commands from ending up at
     * the end of the previous line if cpp is invoked with the -C option.
     */

    int c;
    char *tp;
    int hash;
    char *ep;
    ReturnCode ret;

    c = skipws( global );

    if( c == '\n' || c == EOF_CHAR )
        {
        (*counter)++;

        return(FPP_OK);
        }

    if( !isdigit(c) )
        scanid( global, c );                  /* Get #word to tokenbuf        */
    else
        {
        unget( global );                    /* Hack -- allow #123 as a      */

        strcpy( global->tokenbuf, "line" );   /* synonym for #line 123        */
        }

    hash = (global->tokenbuf[1] == EOS) ? L_nogood : (global->tokenbuf[0] + (global->tokenbuf[2] << 1));

    switch( hash )
        {
        case L_assert:
            tp = "assert";
            break;
        case L_define:
            tp = "define";
            break;
        case L_elif:
            tp = "elif";
            break;
        case L_else:
            tp = "else";
            break;
        case L_endif:
            tp = "endif";
            break;
        case L_error:
            tp = "error";
            break;
        case L_if:
            tp = "if";
            break;
        case L_ifdef:
            tp = "ifdef";
            break;
        case L_ifndef:
            tp = "ifndef";
            break;
        case L_include:
            tp = "include";
            break;
        case L_line:
            tp = "line";
            break;
        case L_pragma:
            tp = "pragma";
            break;
        case L_undef:
            tp = "undef";
            break;
        default:
            hash = L_nogood;
        case L_nogood:
            tp = "";
            break;
        }

    if( !streq( tp, global->tokenbuf ) )
        hash = L_nogood;

    /*
     * hash is set to a unique value corresponding to the
     * control keyword (or L_nogood if we think it's nonsense).
     */
    if( global->infile->fp == NULL )
        cwarn( global, WARN_CONTROL_LINE_IN_MACRO, global->tokenbuf );

    if( !compiling )
        {                       /* Not compiling now    */
        switch( hash )
            {
            case L_if:              /* These can't turn     */
            case L_ifdef:           /*  compilation on, but */
            case L_ifndef:          /*   we must nest #if's */
                if( ++global->ifptr >= &global->ifstack[BLK_NEST] )
                    {
                    cfatal( global, FATAL_TOO_MANY_NESTINGS, global->tokenbuf );

                    return( FPP_TOO_MANY_NESTED_STATEMENTS );
                    }

                *global->ifptr = 0;       /* !WAS_COMPILING   */

            case L_line:            /* Many         */
                /*
                 * Are pragma's always processed?
                 */
            case L_pragma:          /*  options     */
            case L_include:         /*   are uninteresting  */
            case L_define:          /*    if we     */
            case L_undef:           /*     aren't           */
            case L_assert:          /*  compiling.  */
            case L_error:
                dump_line( global, counter );       /* Ignore rest of line  */
                return(FPP_OK);
            }
        }
    /*
     * Make sure that #line and #pragma are output on a fresh line.
     */
    if( *counter > 0 && (hash == L_line || hash == L_pragma) )
        {
        Putchar( global, '\n' );

        (*counter)--;
        }

    switch( hash )
        {
        case L_line:
            /*
             * Parse the line to update the line number and "progname"
             * field and line number for the next input line.
             * Set wrongline to force it out later.
             */
            c = skipws( global );

            global->workp = global->work;       /* Save name in work    */

            while( c != '\n' && c != EOF_CHAR )
                {
                if( (ret = save( global, c )) )
                    return(ret);

                c = get( global );
                }

            unget( global );

            if( (ret = save( global, EOS )) )
                return(ret);

            /*
             * Split #line argument into <line-number> and <name>
             * We subtract 1 as we want the number of the next line.
             */
            global->line = atoi(global->work) - 1;     /* Reset line number    */

            for( tp = global->work; isdigit(*tp) || type[(uint8_t)*tp] == SPA; tp++)
                ;             /* Skip over digits */

            if( *tp != EOS )
                {
                /* Got a filename, so:  */

                if( *tp == '"' && (ep = strrchr(tp + 1, '"')) != NULL )
                    {
                    tp++;           /* Skip over left quote */

                    *ep = EOS;      /* And ignore right one */
                    }

                if( global->infile->progname != NULL )
                    /* Give up the old name if it's allocated.   */
                    Freemem( global->infile->progname );

                global->infile->progname = savestring( global, tp );
                }

            global->wrongline = TRUE;           /* Force output later   */
            break;

        case L_include:
            ret = doinclude( global );
            if( ret )
                return(ret);
            break;

        case L_define:
            ret = dodefine( global );
            if( ret )
                return(ret);
            break;

        case L_undef:
            doundef( global );
            break;

        case L_else:
            if( global->ifptr == &global->ifstack[0] )
                {
                cerror( global, ERROR_STRING_MUST_BE_IF, global->tokenbuf );

                dump_line( global, counter );

                return( FPP_OK );
                }
            else if( (*global->ifptr & ELSE_SEEN) != 0 )
                {
                cerror( global, ERROR_STRING_MAY_NOT_FOLLOW_ELSE, global->tokenbuf );

                dump_line( global, counter );

                return( FPP_OK );
                }

            *global->ifptr |= ELSE_SEEN;

            if( (*global->ifptr & WAS_COMPILING) != 0 )
                {
                if( compiling || (*global->ifptr & TRUE_SEEN) != 0 )
                    compiling = FALSE;
                else
                    {
                    compiling = TRUE;
                    }
                }
            break;

        case L_elif:
            if( global->ifptr == &global->ifstack[0] )
                {
                cerror( global, ERROR_STRING_MUST_BE_IF, global->tokenbuf );

                dump_line( global, counter );

                return( FPP_OK );
                }
            else if( (*global->ifptr & ELSE_SEEN) != 0 )
                {
                cerror( global, ERROR_STRING_MAY_NOT_FOLLOW_ELSE, global->tokenbuf );

                dump_line( global, counter );

                return( FPP_OK );
                }

            if( (*global->ifptr & (WAS_COMPILING | TRUE_SEEN)) != WAS_COMPILING )
                {
                compiling = FALSE;        /* Done compiling stuff */

                dump_line( global, counter );   /* Skip this clause */

                return( FPP_OK );
                }

            ret = doif( global, L_if );

            if( ret )
                return(ret);

            break;

        case L_error:
            cerror(global, ERROR_ERROR);
            break;

        case L_if:
        case L_ifdef:
        case L_ifndef:
            if( ++global->ifptr < &global->ifstack[BLK_NEST] )
                {
                *global->ifptr = WAS_COMPILING;

                ret = doif( global, hash );

                if( ret )
                    return(ret);

                break;
                }

            cfatal( global, FATAL_TOO_MANY_NESTINGS, global->tokenbuf );

            return( FPP_TOO_MANY_NESTED_STATEMENTS );

        case L_endif:
            if( global->ifptr == &global->ifstack[0] )
                {
                cerror( global, ERROR_STRING_MUST_BE_IF, global->tokenbuf );

                dump_line( global, counter );

                return(FPP_OK);
                }

            if( !compiling && (*global->ifptr & WAS_COMPILING) != 0 )
                global->wrongline = TRUE;

            compiling = ((*global->ifptr & WAS_COMPILING) != 0);

            --global->ifptr;

            break;

        case L_assert:
            {
            int result;

            ret = eval( global, &result );

            if(ret)
                return(ret);

            if( result == 0 )
                cerror( global, ERROR_PREPROC_FAILURE );
            }
            break;

        case L_pragma:
            /*
             * #pragma is provided to pass "options" to later
             * passes of the compiler.  cpp doesn't have any yet.
             */
            Putstring( global, "#pragma " );

            while( (c = get( global ) ) != '\n' && c != EOF_CHAR )
                Putchar( global, c );

            unget( global );

            Putchar( global, '\n' );

            break;

        default:
            /*
             * Undefined #control keyword.
             * Note: the correct behavior may be to warn and
             * pass the line to a subsequent compiler pass.
             * This would allow #asm or similar extensions.
             */
            if( global->warnillegalcpp )
                cwarn( global, WARN_ILLEGAL_COMMAND, global->tokenbuf );

            Putchar( global, '#' );
            Putstring( global, global->tokenbuf );
            Putchar( global, ' ' );

            while( (c = get( global ) ) != '\n' && c != EOF_CHAR )
                Putchar( global, c );

            unget( global );

            Putchar( global, '\n' );

            break;
        }

    if( hash != L_include )
        {
        #if OLD_PREPROCESSOR
        /*
         * Ignore the rest of the #control line so you can write
         *      #if foo
         *      #endif  foo
         */
        dump_line( global, counter );         /* Take common exit */

        return( FPP_OK );
        #else
        if( skipws( global ) != '\n' )
            {
            cwarn( global, WARN_UNEXPECTED_TEXT_IGNORED );

            skipnl( global );
            }
        #endif
        }

    (*counter)++;

    return( FPP_OK );
}